

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O1

void __thiscall QPDFWriter::setStreamDataMode(QPDFWriter *this,qpdf_stream_data_e mode)

{
  element_type *peVar1;
  bool bVar2;
  qpdf_stream_decode_level_e qVar3;
  
  if (mode == qpdf_s_compress) {
    peVar1 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    qVar3 = qpdf_dl_generalized;
    if (1 < (int)peVar1->stream_decode_level) {
      qVar3 = peVar1->stream_decode_level;
    }
    peVar1->stream_decode_level = qVar3;
    bVar2 = true;
  }
  else {
    if (mode == qpdf_s_preserve) {
      peVar1 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      peVar1->stream_decode_level = qpdf_dl_none;
    }
    else {
      if (mode != qpdf_s_uncompress) goto LAB_001e670f;
      peVar1 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      qVar3 = qpdf_dl_generalized;
      if (1 < (int)peVar1->stream_decode_level) {
        qVar3 = peVar1->stream_decode_level;
      }
      peVar1->stream_decode_level = qVar3;
    }
    bVar2 = false;
  }
  peVar1->compress_streams = bVar2;
LAB_001e670f:
  peVar1 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  peVar1->stream_decode_level_set = true;
  peVar1->compress_streams_set = true;
  return;
}

Assistant:

void
QPDFWriter::setStreamDataMode(qpdf_stream_data_e mode)
{
    switch (mode) {
    case qpdf_s_uncompress:
        m->stream_decode_level = std::max(qpdf_dl_generalized, m->stream_decode_level);
        m->compress_streams = false;
        break;

    case qpdf_s_preserve:
        m->stream_decode_level = qpdf_dl_none;
        m->compress_streams = false;
        break;

    case qpdf_s_compress:
        m->stream_decode_level = std::max(qpdf_dl_generalized, m->stream_decode_level);
        m->compress_streams = true;
        break;
    }
    m->stream_decode_level_set = true;
    m->compress_streams_set = true;
}